

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void printMemOperand(MCInst *MI,int opNum,SStream *O,char *Modifier)

{
  uint8_t *puVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  MCOperand *op;
  int64_t iVar5;
  
  set_mem_access(MI,true);
  printOperand(MI,opNum,O);
  if (Modifier == (char *)0x0) {
LAB_001c2f86:
    op = MCInst_getOperand(MI,opNum + 1);
    _Var2 = MCOperand_isReg(op);
    if (_Var2) {
      uVar4 = MCOperand_getReg(op);
      if (uVar4 == 0x47) goto LAB_001c2ff6;
    }
    _Var2 = MCOperand_isImm(op);
    if (_Var2) {
      iVar5 = MCOperand_getImm(op);
      if (iVar5 == 0) goto LAB_001c2ff6;
    }
    SStream_concat0(O,"+");
  }
  else {
    iVar3 = strcmp(Modifier,"arith");
    if (iVar3 != 0) goto LAB_001c2f86;
    SStream_concat0(O,", ");
  }
  printOperand(MI,opNum + 1,O);
LAB_001c2ff6:
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.rex;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O)
{
	// Load/Store memory operands -- imm($reg)
	// If PIC target the target is loaded as the
	// pattern lw $25,%call16($28)
	set_mem_access(MI, true);
	printOperand(MI, opNum + 1, O);
	SStream_concat0(O, "(");
	printOperand(MI, opNum, O);
	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}